

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

void __thiscall
llama_context::llama_context(llama_context *this,llama_model *model,llama_context_params params)

{
  llama_cparams *cparams;
  _Rb_tree_header *p_Var1;
  ggml_backend_sched_ptr *this_00;
  pointer *pppgVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 uVar5;
  llama_pooling_type lVar6;
  uint32_t uVar7;
  pointer ppgVar8;
  ggml_backend_device *pgVar9;
  pointer puVar10;
  llama_kv_cache_unified *plVar11;
  pointer ppgVar12;
  iterator __position;
  pointer pfVar13;
  llama_context_params lVar14;
  bool bVar15;
  byte bVar16;
  char cVar17;
  int iVar18;
  uint uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  llama_token lVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  undefined8 uVar26;
  ggml_backend_t pgVar27;
  long lVar28;
  undefined8 uVar29;
  llama_kv_cache_unified *plVar30;
  size_t sVar31;
  size_t sVar32;
  long lVar33;
  pointer __p;
  llama_ubatch *plVar34;
  pointer ppgVar35;
  runtime_error *prVar36;
  uint uVar37;
  pointer ppgVar38;
  char *pcVar39;
  llama_pooling_type lVar40;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *backend_2;
  pointer ppgVar41;
  pointer puVar42;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *backend_3;
  ulong uVar43;
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  _Head_base<0UL,_ggml_backend_*,_false> local_d8;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  string local_c0;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
  *local_80;
  ggml_backend_buffer_ptr *local_78;
  vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>> *local_70;
  int local_64;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  vector<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>,std::allocator<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>>>
  *local_58;
  vector<ggml_backend*,std::allocator<ggml_backend*>> *local_50;
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  llama_model *local_38;
  
  lVar14 = params;
  this->model = model;
  (this->cvec).layer_start = -1;
  (this->cvec).layer_end = -1;
  (this->cvec).ctxs.
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cvec).ctxs.
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cvec).ctxs.
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cvec).bufs.
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cvec).bufs.
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cvec).bufs.
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cvec).tensors.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cvec).tensors.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cvec).tensors.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->loras)._M_h._M_buckets = &(this->loras)._M_h._M_single_bucket;
  (this->loras)._M_h._M_bucket_count = 1;
  (this->loras)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->loras)._M_h._M_element_count = 0;
  (this->loras)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->loras)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->loras)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->embd_seq)._M_t._M_impl.super__Rb_tree_header;
  (this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&(this->sbatch).ids,0,0x129);
  this->logits_size = 0;
  this->logits = (float *)0x0;
  this->embd_size = 0;
  this->embd = (float *)0x0;
  (this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this_00 = &this->sched;
  local_80 = (vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
              *)&this->backends;
  local_58 = (vector<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>,std::allocator<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>>>
              *)&this->set_n_threads_fns;
  local_50 = (vector<ggml_backend*,std::allocator<ggml_backend*>> *)&this->backend_ptrs;
  local_70 = (vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>> *)
             &this->backend_buft;
  local_60 = &this->buf_compute_meta;
  local_78 = &this->buf_output;
  memset(&(this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xe1);
  this->t_start_us = 0;
  this->t_load_us = 0;
  this->t_p_eval_us = 0;
  this->t_eval_us = 0;
  this->t_compute_start_us = 0;
  this->n_queued_tokens = 0;
  this->n_p_eval = 0;
  this->n_eval = 0;
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: constructing llama_context\n","llama_context");
  uVar3 = model->t_load_us;
  uVar4 = model->t_start_us;
  auVar44._8_4_ = (int)uVar3;
  auVar44._0_8_ = uVar4;
  auVar44._12_4_ = (int)((ulong)uVar3 >> 0x20);
  this->t_start_us = uVar4;
  this->t_load_us = auVar44._8_8_;
  uVar37 = params.n_seq_max + (params.n_seq_max == 0);
  (this->cparams).n_seq_max = uVar37;
  (this->cparams).n_threads = params.n_threads;
  (this->cparams).n_threads_batch = params.n_threads_batch;
  (this->cparams).yarn_ext_factor = params.yarn_ext_factor;
  (this->cparams).yarn_attn_factor = params.yarn_attn_factor;
  (this->cparams).yarn_beta_fast = params.yarn_beta_fast;
  (this->cparams).yarn_beta_slow = params.yarn_beta_slow;
  (this->cparams).defrag_thold = params.defrag_thold;
  (this->cparams).embeddings = params.embeddings;
  (this->cparams).offload_kqv = params.offload_kqv;
  (this->cparams).flash_attn = params.flash_attn;
  params.no_perf = lVar14.no_perf;
  (this->cparams).no_perf = params.no_perf;
  (this->cparams).pooling_type = params.pooling_type;
  (this->cparams).warmup = false;
  uVar19 = (model->hparams).n_ctx_train;
  if (params.n_ctx == 0) {
    params.n_ctx = uVar19;
  }
  (this->cparams).n_ctx = params.n_ctx;
  (this->cparams).rope_freq_base =
       (float)(~-(uint)(params.rope_freq_base == 0.0) & (uint)params.rope_freq_base |
              (uint)(model->hparams).rope_freq_base_train & -(uint)(params.rope_freq_base == 0.0));
  (this->cparams).rope_freq_scale =
       (float)(~-(uint)(params.rope_freq_scale == 0.0) & (uint)params.rope_freq_scale |
              (uint)(model->hparams).rope_freq_scale_train & -(uint)(params.rope_freq_scale == 0.0))
  ;
  uVar23 = (model->hparams).n_ctx_orig_yarn;
  if (uVar23 == 0) {
    uVar23 = uVar19;
  }
  if (params.yarn_orig_ctx != 0) {
    uVar23 = params.yarn_orig_ctx;
  }
  (this->cparams).n_ctx_orig_yarn = uVar23;
  (this->cparams).cb_eval = params.cb_eval;
  (this->cparams).cb_eval_user_data = params.cb_eval_user_data;
  if (params.rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_UNSPECIFIED) {
    params.rope_scaling_type = (model->hparams).rope_scaling_type_train;
  }
  if (params.rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_NONE) {
    (this->cparams).rope_freq_scale = 1.0;
  }
  fVar45 = 0.0;
  if (params.yarn_ext_factor < 0.0) {
    if (params.rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_YARN) {
      fVar45 = 1.0;
    }
    (this->cparams).yarn_ext_factor = fVar45;
  }
  (this->cparams).yarn_attn_factor = params.yarn_attn_factor * (model->hparams).rope_attn_factor;
  if (params.pooling_type == LLAMA_POOLING_TYPE_UNSPECIFIED) {
    lVar6 = (model->hparams).pooling_type;
    lVar40 = LLAMA_POOLING_TYPE_NONE;
    if (lVar6 != LLAMA_POOLING_TYPE_UNSPECIFIED) {
      lVar40 = lVar6;
    }
    (this->cparams).pooling_type = lVar40;
  }
  uVar5 = params.attention_type == LLAMA_ATTENTION_TYPE_CAUSAL;
  if (params.attention_type == LLAMA_ATTENTION_TYPE_UNSPECIFIED) {
    uVar5 = (model->hparams).causal_attn;
  }
  (this->cparams).causal_attn = (bool)uVar5;
  uVar19 = params.n_ctx;
  if (params.n_batch < params.n_ctx) {
    uVar19 = params.n_batch;
  }
  if ((uVar5 & 1) == 0) {
    uVar19 = params.n_batch;
  }
  (this->cparams).n_batch = uVar19;
  if (uVar19 < 0x40) {
    uVar19 = 0x40;
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: n_batch is less than GGML_KQ_MASK_PAD - increasing to %d\n",
                       "llama_context",0x40);
    (this->cparams).n_batch = 0x40;
    params.n_ctx = (this->cparams).n_ctx;
    uVar37 = (this->cparams).n_seq_max;
  }
  if (params.n_ubatch != 0) {
    params.n_batch = params.n_ubatch;
  }
  if (uVar19 <= params.n_batch) {
    params.n_batch = uVar19;
  }
  (this->cparams).n_ubatch = params.n_batch;
  uVar43 = (ulong)params.n_ctx / (ulong)uVar37;
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_seq_max     = %u\n","llama_context");
  cparams = &this->cparams;
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ctx         = %u\n","llama_context",
                     (ulong)cparams->n_ctx);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ctx_per_seq = %u\n","llama_context",uVar43);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_batch       = %u\n","llama_context",
                     (ulong)(this->cparams).n_batch);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ubatch      = %u\n","llama_context",
                     (ulong)(this->cparams).n_ubatch);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: causal_attn   = %d\n","llama_context",
                     (ulong)(this->cparams).causal_attn);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: flash_attn    = %d\n","llama_context",
                     (ulong)(this->cparams).flash_attn);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: freq_base     = %.1f\n",
                     (double)(this->cparams).rope_freq_base,"llama_context");
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: freq_scale    = %g\n",
                     (double)(this->cparams).rope_freq_scale,"llama_context");
  uVar19 = (model->hparams).n_ctx_train;
  if ((uint)uVar43 < uVar19) {
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: n_ctx_per_seq (%u) < n_ctx_train (%u) -- the full capacity of the model will not be utilized\n"
                       ,"llama_context",uVar43);
    uVar19 = (model->hparams).n_ctx_train;
  }
  if (uVar19 < (uint)uVar43) {
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: n_ctx_pre_seq (%u) > n_ctx_train (%u) -- possible training context overflow\n"
                       ,"llama_context",uVar43);
  }
  this->logits_all = params.logits_all;
  bVar16 = (model->hparams).vocab_only;
  if ((bool)bVar16 == false) {
    ppgVar41 = (model->devices).
               super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppgVar8 = (model->devices).
              super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppgVar41 != ppgVar8) {
      do {
        pgVar9 = *ppgVar41;
        local_d8._M_head_impl = (ggml_backend *)ggml_backend_dev_init(pgVar9,0);
        if (local_d8._M_head_impl == (ggml_backend *)0x0) {
          prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
          uVar26 = ggml_backend_dev_name(pgVar9);
          format_abi_cxx11_(&local_c0,"failed to initialize %s backend",uVar26);
          std::runtime_error::runtime_error(prVar36,(string *)&local_c0);
          __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
        ::emplace_back<ggml_backend*&>(local_80,&local_d8._M_head_impl);
        ppgVar41 = ppgVar41 + 1;
      } while (ppgVar41 != ppgVar8);
    }
    for (uVar43 = 0; uVar25 = ggml_backend_dev_count(), uVar43 < uVar25; uVar43 = uVar43 + 1) {
      uVar26 = ggml_backend_dev_get(uVar43);
      iVar18 = ggml_backend_dev_type();
      if (iVar18 == 2) {
        local_d8._M_head_impl = (ggml_backend *)ggml_backend_dev_init(uVar26,0);
        if (local_d8._M_head_impl == (ggml_backend *)0x0) {
          prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
          uVar26 = ggml_backend_dev_name(uVar26);
          format_abi_cxx11_(&local_c0,"failed to initialize %s backend",uVar26);
          std::runtime_error::runtime_error(prVar36,(string *)&local_c0);
          __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
        ::emplace_back<ggml_backend*&>(local_80,&local_d8._M_head_impl);
      }
    }
    pgVar27 = (ggml_backend_t)ggml_backend_init_by_type(0,0);
    this->backend_cpu = pgVar27;
    if (pgVar27 == (ggml_backend_t)0x0) {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"failed to initialize CPU backend");
LAB_0018dc06:
      __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
    ::emplace_back<ggml_backend*&>(local_80,&this->backend_cpu);
    puVar42 = (this->backends).
              super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar10 = (this->backends).
              super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar42 != puVar10) {
      do {
        lVar28 = ggml_backend_get_device
                           ((puVar42->_M_t).
                            super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                            super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl);
        if ((lVar28 != 0) && (lVar28 = ggml_backend_dev_backend_reg(lVar28), lVar28 != 0)) {
          lVar28 = ggml_backend_reg_get_proc_address(lVar28,"ggml_backend_set_n_threads");
          local_c0._M_dataplus._M_p._0_4_ = (undefined4)lVar28;
          local_c0._M_dataplus._M_p._4_4_ = (uint)((ulong)lVar28 >> 0x20);
          if (lVar28 != 0) {
            local_d8._M_head_impl =
                 (puVar42->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t.
                 super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                 super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl;
            std::
            vector<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>,std::allocator<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>>>
            ::emplace_back<ggml_backend*,void(*&)(ggml_backend*,int)>
                      (local_58,&local_d8._M_head_impl,(_func_void_ggml_backend_ptr_int **)&local_c0
                      );
          }
        }
        puVar42 = puVar42 + 1;
      } while (puVar42 != puVar10);
    }
    set_abort_callback(this,params.abort_callback,params.abort_callback_data);
    uVar19 = output_reserve(this,params.n_seq_max);
    if (uVar19 < params.n_seq_max) {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"failed to reserve initial output buffer");
      goto LAB_0018dc06;
    }
    uVar26 = ggml_backend_buffer_name
                       ((local_78->_M_t).
                        super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t
                        .super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
                        super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl);
    uVar29 = ggml_backend_buffer_get_size
                       ((local_78->_M_t).
                        super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t
                        .super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
                        super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl);
    auVar46._8_4_ = (int)((ulong)uVar29 >> 0x20);
    auVar46._0_8_ = uVar29;
    auVar46._12_4_ = 0x45300000;
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: %10s  output buffer size = %8.2f MiB\n",
                       ((auVar46._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar29) - 4503599627370496.0)) *
                       0.0009765625 * 0.0009765625,"llama_context",uVar26);
    bVar16 = (model->hparams).vocab_only;
  }
  if ((bVar16 & 1) == 0) {
    plVar30 = (llama_kv_cache_unified *)llama_model::create_memory(model);
    plVar11 = (this->kv_self)._M_t.
              super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ._M_t.
              super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
              .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
    (this->kv_self)._M_t.
    super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>._M_t
    .super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>.
    super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl = plVar30;
    if (plVar11 != (llama_kv_cache_unified *)0x0) {
      (**(code **)((long)(plVar11->super_llama_kv_cache).super_llama_memory_i + 0x78))();
    }
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: n_ctx = %u\n","llama_context",(ulong)cparams->n_ctx
                      );
    uVar7 = (this->cparams).n_ctx;
    uVar20 = llama_kv_cache_unified::get_padding
                       ((this->kv_self)._M_t.
                        super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                        .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,cparams
                       );
    uVar21 = llama_kv_cache_unified::get_padding
                       ((this->kv_self)._M_t.
                        super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                        .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,cparams
                       );
    uVar19 = -uVar21 & (uVar7 + uVar20) - 1;
    cparams->n_ctx = uVar19;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: n_ctx = %u (padded)\n","llama_context",
                       (ulong)uVar19);
    uVar7 = cparams->n_ctx;
    bVar15 = llama_model_is_recurrent(model);
    if (bVar15) {
      uVar7 = params.n_seq_max + (params.n_seq_max == 0);
      params.type_k = GGML_TYPE_F32;
      params.type_v = GGML_TYPE_F32;
    }
    uVar19 = (model->hparams).n_embd_head_k;
    lVar28 = ggml_blck_size(params.type_k);
    if (SUB168(ZEXT416(uVar19) % SEXT816(lVar28),0) != 0) {
      pcVar39 = "hparams.n_embd_head_k % ggml_blck_size(type_k) == 0";
      uVar26 = 0xca;
LAB_0018dae3:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,uVar26,"GGML_ASSERT(%s) failed",pcVar39);
    }
    uVar19 = (model->hparams).n_embd_head_v;
    lVar28 = ggml_blck_size(params.type_v);
    if (SUB168(ZEXT416(uVar19) % SEXT816(lVar28),0) != 0) {
      pcVar39 = "hparams.n_embd_head_v % ggml_blck_size(type_v) == 0";
      uVar26 = 0xcb;
      goto LAB_0018dae3;
    }
    iVar18 = llama_kv_cache_unified::init
                       ((this->kv_self)._M_t.
                        super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                        .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,model,
                        cparams,params.type_k,params.type_v,uVar7,(this->cparams).offload_kqv);
    if ((char)iVar18 == '\0') {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"failed to initialize self-attention cache");
      __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar31 = llama_kv_cache_unified::size_k_bytes
                       ((this->kv_self)._M_t.
                        super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                        .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl);
    sVar32 = llama_kv_cache_unified::size_v_bytes
                       ((this->kv_self)._M_t.
                        super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                        .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl);
    uVar26 = ggml_type_name(params.type_k);
    uVar29 = ggml_type_name(params.type_v);
    llama_log_internal(GGML_LOG_LEVEL_INFO,
                       "%s: KV self size  = %7.2f MiB, K (%s): %7.2f MiB, V (%s): %7.2f MiB\n",
                       (double)((float)(sVar32 + sVar31) * 9.536743e-07),
                       (double)((float)sVar31 * 9.536743e-07),(double)((float)sVar32 * 9.536743e-07)
                       ,"llama_context",uVar26,uVar29);
    bVar16 = (model->hparams).vocab_only;
  }
  if ((bVar16 & 1) != 0) goto LAB_0018d53b;
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: enumerating backends\n","llama_context");
  ppgVar12 = (this->backend_buft).
             super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->backend_buft).
      super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppgVar12) {
    (this->backend_buft).
    super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppgVar12;
  }
  ppgVar35 = (this->backend_ptrs).
             super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppgVar35) {
    (this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppgVar35;
  }
  puVar42 = (this->backends).
            super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (this->backends).
            super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppgVar38 = ppgVar35;
  if (puVar42 != puVar10) {
    do {
      uVar26 = ggml_backend_get_default_buffer_type
                         ((puVar42->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>.
                          _M_t.super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                          super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl);
      local_c0._M_dataplus._M_p._0_4_ = (undefined4)uVar26;
      local_c0._M_dataplus._M_p._4_4_ = (uint)((ulong)uVar26 >> 0x20);
      uVar26 = ggml_backend_get_device
                         ((puVar42->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>.
                          _M_t.super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                          super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl);
      iVar18 = ggml_backend_dev_type(uVar26);
      if (((iVar18 == 0) &&
          (ppgVar41 = (model->devices).
                      super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
          ppgVar41 !=
          (model->devices).
          super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
          super__Vector_impl_data._M_finish)) &&
         (lVar28 = ggml_backend_dev_host_buffer_type(*ppgVar41), lVar28 != 0)) {
        local_c0._M_dataplus._M_p._0_4_ = (undefined4)lVar28;
        local_c0._M_dataplus._M_p._4_4_ = (uint)((ulong)lVar28 >> 0x20);
      }
      __position._M_current =
           (this->backend_buft).
           super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->backend_buft).
          super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>>::
        _M_realloc_insert<ggml_backend_buffer_type*const&>
                  (local_70,__position,(ggml_backend_buffer_type **)&local_c0);
      }
      else {
        *__position._M_current =
             (ggml_backend_buffer_type *)
             CONCAT44(local_c0._M_dataplus._M_p._4_4_,local_c0._M_dataplus._M_p._0_4_);
        pppgVar2 = &(this->backend_buft).
                    super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppgVar2 = *pppgVar2 + 1;
      }
      local_d8._M_head_impl =
           (puVar42->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t.
           super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
           super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl;
      std::vector<ggml_backend*,std::allocator<ggml_backend*>>::emplace_back<ggml_backend*>
                (local_50,&local_d8._M_head_impl);
      puVar42 = puVar42 + 1;
    } while (puVar42 != puVar10);
    ppgVar35 = (this->backend_ptrs).
               super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppgVar38 = (this->backend_ptrs).
               super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
  }
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: backend_ptrs.size() = %zu\n","llama_context",
                     (long)ppgVar38 - (long)ppgVar35 >> 3);
  sVar31 = llama_model::n_tensors(this->model);
  uVar19 = (int)sVar31 * 5;
  uVar43 = 0x10000;
  if (0x10000 < (int)uVar19) {
    uVar43 = (ulong)uVar19;
  }
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: max_nodes = %zu\n","llama_context",uVar43);
  lVar28 = ggml_tensor_overhead();
  lVar33 = ggml_graph_overhead_custom(uVar43,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (local_60,lVar33 + lVar28 * uVar43);
  sVar31 = llama_model::n_devices(model);
  if (sVar31 < 2) {
LAB_0018d4d6:
    cVar17 = '\0';
  }
  else {
    cVar17 = '\0';
    if (((int)(model->hparams).n_layer < (model->params).n_gpu_layers) &&
       (cVar17 = '\0', (model->params).split_mode == LLAMA_SPLIT_MODE_LAYER)) {
      if (((this->cparams).offload_kqv != true) ||
         (bVar15 = llama_model::has_tensor_overrides(model), bVar15)) goto LAB_0018d4d6;
      puVar10 = (this->backends).
                super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      cVar17 = '\x01';
      for (puVar42 = (this->backends).
                     super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar42 != puVar10;
          puVar42 = puVar42 + 1) {
        uVar26 = ggml_backend_get_device
                           ((puVar42->_M_t).
                            super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t.
                            super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                            super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl);
        iVar18 = ggml_backend_dev_type(uVar26);
        if (iVar18 != 0) {
          uVar26 = ggml_backend_get_device
                             ((puVar42->_M_t).
                              super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t.
                              super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                              super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl);
          ggml_backend_dev_get_props(uVar26,&local_c0);
          if ((uStack_a0._4_1_ == '\0') || ((uStack_a0 & 0x100000000000000) == 0))
          goto LAB_0018d4d6;
        }
      }
    }
  }
  ppgVar35 = (this->backend_ptrs).
             super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  __p = (pointer)ggml_backend_sched_new
                           (ppgVar35,(this->backend_buft).
                                     super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)(this->backend_ptrs).
                                          super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppgVar35) >> 3,uVar43,cVar17);
  std::__uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>::reset
            ((__uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_00,__p);
  if (cVar17 != '\0') {
    uVar19 = ggml_backend_sched_get_n_copies
                       ((this_00->_M_t).
                        super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                        super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: pipeline parallelism enabled (n_copies=%d)\n",
                       "llama_context",(ulong)uVar19);
  }
LAB_0018d53b:
  if ((model->hparams).vocab_only == false) {
    uVar19 = (this->cparams).n_ctx;
    uVar37 = (this->cparams).n_ubatch;
    if (uVar37 < uVar19) {
      uVar19 = uVar37;
    }
    lVar22 = llama_vocab::token_bos(&model->vocab);
    local_d8._M_head_impl._0_4_ = lVar22;
    uVar37 = this->n_outputs;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                       "%s: worst-case: n_tokens = %d, n_seqs = %d, n_outputs = %d\n",
                       "llama_context",(ulong)uVar19,1,(ulong)uVar37);
    plVar11 = (this->kv_self)._M_t.
              super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ._M_t.
              super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
              .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
    plVar11->n = plVar11->size;
    pfVar13 = (this->cross).v_embd.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->cross).v_embd.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar13) {
      (this->cross).v_embd.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar13;
    }
    local_c0._M_dataplus._M_p._0_4_ = CONCAT31(local_c0._M_dataplus._M_p._1_3_,1);
    local_c0._M_string_length._4_4_ = 1;
    local_c0.field_2._8_8_ = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    this->n_outputs = uVar19;
    local_c0._M_dataplus._M_p._4_4_ = uVar19;
    local_c0._M_string_length._0_4_ = uVar19;
    local_c0.field_2._M_allocated_capacity = (size_type)&local_d8;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reserving graph for n_tokens = %d, n_seqs = %d\n",
                       "llama_context",(ulong)uVar19,1);
    plVar34 = (llama_ubatch *)graph_init(this);
    graph_build((llama_context *)&stack0xffffffffffffffc8,(ggml_context *)this,
                (ggml_cgraph *)
                (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,plVar34,
                (llm_graph_type)&local_c0);
    if (local_38 != (llama_model *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
    local_38 = (llama_model *)0x0;
    cVar17 = ggml_backend_sched_reserve
                       ((this_00->_M_t).
                        super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                        super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,plVar34);
    if (cVar17 == '\0') {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"failed to allocate compute pp buffers");
      __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar23 = ggml_backend_sched_get_n_splits
                       ((this_00->_M_t).
                        super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                        super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
    iVar18 = ggml_graph_n_nodes(plVar34);
    local_c0._M_dataplus._M_p._0_4_ = CONCAT31(local_c0._M_dataplus._M_p._1_3_,1);
    local_c0._M_dataplus._M_p._4_4_ = 1;
    local_c0._M_string_length._0_4_ = 1;
    local_c0._M_string_length._4_4_ = 1;
    local_c0.field_2._8_8_ = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    this->n_outputs = 1;
    local_c0.field_2._M_allocated_capacity = (size_type)&local_d8;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reserving graph for n_tokens = %d, n_seqs = %d\n",
                       "llama_context",1,1);
    plVar34 = (llama_ubatch *)graph_init(this);
    graph_build((llama_context *)local_40,(ggml_context *)this,
                (ggml_cgraph *)
                (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,plVar34,
                (llm_graph_type)&local_c0);
    if (local_40 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
    local_40 = (undefined1  [8])0x0;
    cVar17 = ggml_backend_sched_reserve
                       ((this_00->_M_t).
                        super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                        super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,plVar34);
    if (cVar17 == '\0') {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"failed to allocate compute tg buffers");
      __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_c4 = ggml_backend_sched_get_n_splits
                         ((this_00->_M_t).
                          super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t
                          .super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                          super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
    iVar24 = ggml_graph_n_nodes(plVar34);
    local_c0._M_dataplus._M_p._0_4_ = CONCAT31(local_c0._M_dataplus._M_p._1_3_,1);
    local_c0._M_string_length._4_4_ = 1;
    local_c0.field_2._8_8_ = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    this->n_outputs = uVar19;
    local_c0._M_dataplus._M_p._4_4_ = uVar19;
    local_c0._M_string_length._0_4_ = uVar19;
    local_c0.field_2._M_allocated_capacity = (size_type)&local_d8;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reserving graph for n_tokens = %d, n_seqs = %d\n",
                       "llama_context",(ulong)uVar19,1);
    plVar34 = (llama_ubatch *)graph_init(this);
    graph_build((llama_context *)local_48,(ggml_context *)this,
                (ggml_cgraph *)
                (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,plVar34,
                (llm_graph_type)&local_c0);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
    local_48 = (undefined1  [8])0x0;
    cVar17 = ggml_backend_sched_reserve
                       ((this_00->_M_t).
                        super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                        super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,plVar34);
    local_cc = uVar23;
    local_c8 = uVar19;
    local_64 = iVar24;
    if (cVar17 == '\0') {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"failed to allocate compute pp buffers");
      __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->n_outputs = uVar37;
    ppgVar35 = (this->backend_ptrs).
               super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppgVar35) {
      uVar43 = 0;
      do {
        uVar26 = *(undefined8 *)(*(long *)local_70 + uVar43 * 8);
        uVar25 = ggml_backend_sched_get_buffer_size
                           ((this_00->_M_t).
                            super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>.
                            _M_t.
                            super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>
                            .super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,
                            ppgVar35[uVar43]);
        if (1 < uVar25) {
          uVar26 = ggml_backend_buft_name(uVar26);
          auVar47._8_4_ = (int)(uVar25 >> 0x20);
          auVar47._0_8_ = uVar25;
          auVar47._12_4_ = 0x45300000;
          llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: %10s compute buffer size = %8.2f MiB\n",
                             ((auVar47._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar25) - 4503599627370496.0)) *
                             0.0009765625 * 0.0009765625,"llama_context",uVar26);
        }
        uVar43 = uVar43 + 1;
        ppgVar35 = (this->backend_ptrs).
                   super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (uVar43 < (ulong)((long)(this->backend_ptrs).
                                      super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppgVar35 >>
                               3));
    }
    uVar19 = local_c8;
    if (iVar18 == local_64) {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: graph nodes  = %d\n","llama_context");
      uVar19 = local_c8;
    }
    else {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: graph nodes  = %d (with bs=%d), %d (with bs=1)\n",
                         "llama_context",iVar18,(ulong)local_c8);
    }
    if (local_cc == local_c4) {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: graph splits = %d\n","llama_context");
    }
    else {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: graph splits = %d (with bs=%d), %d (with bs=1)\n",
                         "llama_context",(ulong)local_cc,(ulong)uVar19);
    }
  }
  return;
}

Assistant:

llama_context::llama_context(
        const llama_model & model,
              llama_context_params params) :
    model(model) {
    LLAMA_LOG_INFO("%s: constructing llama_context\n", __func__);

    t_start_us = model.t_start_us;
    t_load_us  = model.t_load_us;

    const auto & hparams = model.hparams;

    cparams.n_seq_max        = std::max(1u, params.n_seq_max);
    cparams.n_threads        = params.n_threads;
    cparams.n_threads_batch  = params.n_threads_batch;
    cparams.yarn_ext_factor  = params.yarn_ext_factor;
    cparams.yarn_attn_factor = params.yarn_attn_factor;
    cparams.yarn_beta_fast   = params.yarn_beta_fast;
    cparams.yarn_beta_slow   = params.yarn_beta_slow;
    cparams.defrag_thold     = params.defrag_thold;
    cparams.embeddings       = params.embeddings;
    cparams.offload_kqv      = params.offload_kqv;
    cparams.flash_attn       = params.flash_attn;
    cparams.no_perf          = params.no_perf;
    cparams.pooling_type     = params.pooling_type;
    cparams.warmup           = false;

    cparams.n_ctx            = params.n_ctx           == 0    ? hparams.n_ctx_train           : params.n_ctx;
    cparams.rope_freq_base   = params.rope_freq_base  == 0.0f ? hparams.rope_freq_base_train  : params.rope_freq_base;
    cparams.rope_freq_scale  = params.rope_freq_scale == 0.0f ? hparams.rope_freq_scale_train : params.rope_freq_scale;

    cparams.n_ctx_orig_yarn  = params.yarn_orig_ctx    != 0 ? params.yarn_orig_ctx    :
                               hparams.n_ctx_orig_yarn != 0 ? hparams.n_ctx_orig_yarn :
                                                              hparams.n_ctx_train;

    cparams.cb_eval           = params.cb_eval;
    cparams.cb_eval_user_data = params.cb_eval_user_data;

    auto rope_scaling_type = params.rope_scaling_type;
    if (rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_UNSPECIFIED) {
        rope_scaling_type = hparams.rope_scaling_type_train;
    }

    if (rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_NONE) {
        cparams.rope_freq_scale = 1.0f; // never scale if scaling type is none
    }

    if (cparams.yarn_ext_factor < 0.0f) { // negative indicates 'not set'
        cparams.yarn_ext_factor = rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_YARN ? 1.0f : 0.0f;
    }

    cparams.yarn_attn_factor *= hparams.rope_attn_factor;

    if (cparams.pooling_type == LLAMA_POOLING_TYPE_UNSPECIFIED) {
        if (hparams.pooling_type == LLAMA_POOLING_TYPE_UNSPECIFIED) {
            cparams.pooling_type = LLAMA_POOLING_TYPE_NONE;
        } else {
            cparams.pooling_type = hparams.pooling_type;
        }
    }

    if (params.attention_type == LLAMA_ATTENTION_TYPE_UNSPECIFIED) {
        cparams.causal_attn = hparams.causal_attn;
    } else {
        cparams.causal_attn = params.attention_type == LLAMA_ATTENTION_TYPE_CAUSAL;
    }

    // with causal attention, the batch size is limited by the context size
    cparams.n_batch = cparams.causal_attn ? std::min(cparams.n_ctx, params.n_batch) : params.n_batch;

    // the batch has to be at least GGML_KQ_MASK_PAD because we will be padding the KQ_mask
    // this is required by GPU kernels in order to avoid out-of-bounds accesses (e.g. ggml_flash_attn_ext)
    // ref: https://github.com/ggerganov/llama.cpp/pull/5021
    // TODO: this padding is not needed for the cache-less context so we should probably move it to llama_context_kv_self
    if (cparams.n_batch < GGML_KQ_MASK_PAD) {
        LLAMA_LOG_WARN("%s: n_batch is less than GGML_KQ_MASK_PAD - increasing to %d\n", __func__, GGML_KQ_MASK_PAD);
        cparams.n_batch = GGML_KQ_MASK_PAD;
    }

    cparams.n_ubatch = std::min(cparams.n_batch, params.n_ubatch == 0 ? params.n_batch : params.n_ubatch);

    const uint32_t n_ctx_per_seq = cparams.n_ctx / cparams.n_seq_max;

    LLAMA_LOG_INFO("%s: n_seq_max     = %u\n",   __func__, cparams.n_seq_max);
    LLAMA_LOG_INFO("%s: n_ctx         = %u\n",   __func__, cparams.n_ctx);
    LLAMA_LOG_INFO("%s: n_ctx_per_seq = %u\n",   __func__, n_ctx_per_seq);
    LLAMA_LOG_INFO("%s: n_batch       = %u\n",   __func__, cparams.n_batch);
    LLAMA_LOG_INFO("%s: n_ubatch      = %u\n",   __func__, cparams.n_ubatch);
    LLAMA_LOG_INFO("%s: causal_attn   = %d\n",   __func__, cparams.causal_attn);
    LLAMA_LOG_INFO("%s: flash_attn    = %d\n",   __func__, cparams.flash_attn);
    LLAMA_LOG_INFO("%s: freq_base     = %.1f\n", __func__, cparams.rope_freq_base);
    LLAMA_LOG_INFO("%s: freq_scale    = %g\n",   __func__, cparams.rope_freq_scale);

    if (n_ctx_per_seq < hparams.n_ctx_train) {
        LLAMA_LOG_WARN("%s: n_ctx_per_seq (%u) < n_ctx_train (%u) -- the full capacity of the model will not be utilized\n",
                __func__, n_ctx_per_seq, hparams.n_ctx_train);
    }

    if (n_ctx_per_seq > hparams.n_ctx_train) {
        LLAMA_LOG_WARN("%s: n_ctx_pre_seq (%u) > n_ctx_train (%u) -- possible training context overflow\n",
                __func__, n_ctx_per_seq, hparams.n_ctx_train);
    }

    logits_all = params.logits_all;

    if (!hparams.vocab_only) {
        // GPU backends
        for (auto * dev : model.devices) {
            ggml_backend_t backend = ggml_backend_dev_init(dev, nullptr);
            if (backend == nullptr) {
                throw std::runtime_error(format("failed to initialize %s backend", ggml_backend_dev_name(dev)));
            }
            backends.emplace_back(backend);
        }

        // add ACCEL backends (such as BLAS)
        for (size_t i = 0; i < ggml_backend_dev_count(); ++i) {
            ggml_backend_dev_t dev = ggml_backend_dev_get(i);
            if (ggml_backend_dev_type(dev) == GGML_BACKEND_DEVICE_TYPE_ACCEL) {
                ggml_backend_t backend = ggml_backend_dev_init(dev, nullptr);
                if (backend == nullptr) {
                    throw std::runtime_error(format("failed to initialize %s backend", ggml_backend_dev_name(dev)));
                }
                backends.emplace_back(backend);
            }
        }

        // add CPU backend
        backend_cpu = ggml_backend_init_by_type(GGML_BACKEND_DEVICE_TYPE_CPU, nullptr);
        if (backend_cpu == nullptr) {
            throw std::runtime_error("failed to initialize CPU backend");
        }
        backends.emplace_back(backend_cpu);

        // create a list of the set_n_threads functions in the backends
        for (auto & backend : backends) {
            ggml_backend_dev_t dev = ggml_backend_get_device(backend.get());
            ggml_backend_reg_t reg = dev ? ggml_backend_dev_backend_reg(dev) : nullptr;
            if (reg) {
                auto ggml_backend_set_n_threads_fn = (ggml_backend_set_n_threads_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_set_n_threads");
                if (ggml_backend_set_n_threads_fn) {
                    set_n_threads_fns.emplace_back(backend.get(), ggml_backend_set_n_threads_fn);
                }
            }
        }

        llama_set_abort_callback(this, params.abort_callback, params.abort_callback_data);

        // graph outputs buffer
        {
            // resized during inference when a batch uses more outputs
            if ((uint32_t) output_reserve(params.n_seq_max) < params.n_seq_max) {
                throw std::runtime_error("failed to reserve initial output buffer");
            }

            LLAMA_LOG_INFO("%s: %10s  output buffer size = %8.2f MiB\n", __func__,
                    ggml_backend_buffer_name    (buf_output.get()),
                    ggml_backend_buffer_get_size(buf_output.get()) / 1024.0 / 1024.0);
        }
    }

    // init the memory module
    // TODO: for now, always create a unified KV cache
    if (!hparams.vocab_only) {
        kv_self.reset(static_cast<llama_kv_cache_unified *>(model.create_memory()));

        LLAMA_LOG_DEBUG("%s: n_ctx = %u\n", __func__, cparams.n_ctx);

        cparams.n_ctx = GGML_PAD(cparams.n_ctx, kv_self->get_padding(cparams));

        LLAMA_LOG_DEBUG("%s: n_ctx = %u (padded)\n", __func__, cparams.n_ctx);

        uint32_t kv_size = cparams.n_ctx;
        ggml_type type_k = params.type_k;
        ggml_type type_v = params.type_v;

        if (llama_model_is_recurrent(&model)) {
            // Mamba needs at least as many KV cells as there are sequences kept at any time
            kv_size = std::max((uint32_t) 1, params.n_seq_max);
            // it's probably best to keep as much precision as possible for the states
            type_k = GGML_TYPE_F32; // required by ggml_ssm_conv for Mamba's conv_states
            type_v = GGML_TYPE_F32; // required by ggml_ssm_scan for Mamba's ssm_states
        }

        GGML_ASSERT(hparams.n_embd_head_k % ggml_blck_size(type_k) == 0);
        GGML_ASSERT(hparams.n_embd_head_v % ggml_blck_size(type_v) == 0);

        if (!kv_self->init(model, cparams, type_k, type_v, kv_size, cparams.offload_kqv)) {
            throw std::runtime_error("failed to initialize self-attention cache");
        }

        {
            const size_t memory_size_k = kv_self->size_k_bytes();
            const size_t memory_size_v = kv_self->size_v_bytes();

            LLAMA_LOG_INFO("%s: KV self size  = %7.2f MiB, K (%s): %7.2f MiB, V (%s): %7.2f MiB\n", __func__,
                    (float)(memory_size_k + memory_size_v) / (1024.0f * 1024.0f),
                    ggml_type_name(type_k), (float)memory_size_k / (1024.0f * 1024.0f),
                    ggml_type_name(type_v), (float)memory_size_v / (1024.0f * 1024.0f));
        }
    }

    // init backends
    if (!hparams.vocab_only) {
        LLAMA_LOG_DEBUG("%s: enumerating backends\n", __func__);

        backend_buft.clear();
        backend_ptrs.clear();

        for (auto & backend : backends) {
            auto * buft = ggml_backend_get_default_buffer_type(backend.get());
            auto backend_type = ggml_backend_dev_type(ggml_backend_get_device(backend.get()));

            if (backend_type == GGML_BACKEND_DEVICE_TYPE_CPU && !model.devices.empty()) {
                // use the host buffer of the first device CPU for faster transfer of the intermediate state
                auto * dev = model.devices[0];
                auto * host_buft = ggml_backend_dev_host_buffer_type(dev);
                if (host_buft) {
                    buft = host_buft;
                }
            }

            backend_buft.push_back(buft);
            backend_ptrs.push_back(backend.get());
        }

        LLAMA_LOG_DEBUG("%s: backend_ptrs.size() = %zu\n", __func__, backend_ptrs.size());

        const size_t max_nodes = this->graph_max_nodes();

        LLAMA_LOG_DEBUG("%s: max_nodes = %zu\n", __func__, max_nodes);

        // buffer used to store the computation graph and the tensor meta data
        buf_compute_meta.resize(ggml_tensor_overhead()*max_nodes + ggml_graph_overhead_custom(max_nodes, false));

        // TODO: move these checks to ggml_backend_sched
        // enabling pipeline parallelism in the scheduler increases memory usage, so it is only done when necessary
        bool pipeline_parallel =
            model.n_devices() > 1 &&
            model.params.n_gpu_layers > (int) model.hparams.n_layer &&
            model.params.split_mode == LLAMA_SPLIT_MODE_LAYER &&
            cparams.offload_kqv &&
            !model.has_tensor_overrides();

        // pipeline parallelism requires support for async compute and events in all devices
        if (pipeline_parallel) {
            for (auto & backend : backends) {
                auto dev_type = ggml_backend_dev_type(ggml_backend_get_device(backend.get()));
                if (dev_type == GGML_BACKEND_DEVICE_TYPE_CPU) {
                    // ignore CPU backend
                    continue;
                }
                auto * dev = ggml_backend_get_device(backend.get());
                ggml_backend_dev_props props;
                ggml_backend_dev_get_props(dev, &props);
                if (!props.caps.async || !props.caps.events) {
                    // device does not support async compute or events
                    pipeline_parallel = false;
                    break;
                }
            }
        }

        sched.reset(ggml_backend_sched_new(backend_ptrs.data(), backend_buft.data(), backend_ptrs.size(), max_nodes, pipeline_parallel));

        if (pipeline_parallel) {
            LLAMA_LOG_INFO("%s: pipeline parallelism enabled (n_copies=%d)\n", __func__, ggml_backend_sched_get_n_copies(sched.get()));
        }
    }

    // reserve worst-case graph
    if (!hparams.vocab_only) {
        const uint32_t n_seqs = 1; // TODO: worst-case number of sequences
        const uint32_t n_tokens = std::min(cparams.n_ctx, cparams.n_ubatch);

        llama_token token = model.vocab.token_bos(); // not actually used by llama_build_graph, but required to choose between token and embedding inputs graph

        // restore later
        // TODO: something cleaner
        const auto n_outputs_save = n_outputs;

        LLAMA_LOG_DEBUG("%s: worst-case: n_tokens = %d, n_seqs = %d, n_outputs = %d\n", __func__, n_tokens, n_seqs, n_outputs);

        int n_splits_pp = -1;
        int n_nodes_pp  = -1;

        int n_splits_tg = -1;
        int n_nodes_tg  = -1;

        // simulate full KV cache
        kv_self->n = kv_self->size;

        cross.v_embd.clear();

        // reserve pp graph first so that buffers are only allocated once
        {
            llama_ubatch ubatch_pp = { true, n_tokens, n_tokens / n_seqs, n_seqs, &token, nullptr, nullptr, nullptr, nullptr, nullptr};

            // max number of outputs
            n_outputs = ubatch_pp.n_tokens;

            LLAMA_LOG_DEBUG("%s: reserving graph for n_tokens = %d, n_seqs = %d\n", __func__, ubatch_pp.n_tokens, ubatch_pp.n_seqs);

            auto * gf = graph_init();
            graph_build(ctx_compute.get(), gf, ubatch_pp, LLM_GRAPH_TYPE_DEFAULT);

            if (!ggml_backend_sched_reserve(sched.get(), gf)) {
                throw std::runtime_error("failed to allocate compute pp buffers");
            }

            n_splits_pp = ggml_backend_sched_get_n_splits(sched.get());
            n_nodes_pp  = ggml_graph_n_nodes(gf);
        }

        // reserve with tg graph to get the number of splits and nodes
        {
            llama_ubatch ubatch_tg = { true, 1, 1, n_seqs, &token, nullptr, nullptr, nullptr, nullptr, nullptr};

            n_outputs = ubatch_tg.n_tokens;

            LLAMA_LOG_DEBUG("%s: reserving graph for n_tokens = %d, n_seqs = %d\n", __func__, ubatch_tg.n_tokens, ubatch_tg.n_seqs);

            auto * gf = graph_init();
            graph_build(ctx_compute.get(), gf, ubatch_tg, LLM_GRAPH_TYPE_DEFAULT);

            if (!ggml_backend_sched_reserve(sched.get(), gf)) {
                throw std::runtime_error("failed to allocate compute tg buffers");
            }

            n_splits_tg = ggml_backend_sched_get_n_splits(sched.get());
            n_nodes_tg  = ggml_graph_n_nodes(gf);
        }

        // reserve again with pp graph to avoid ggml-alloc reallocations during inference
        {
            llama_ubatch ubatch_pp = { true, n_tokens, n_tokens / n_seqs, n_seqs, &token, nullptr, nullptr, nullptr, nullptr, nullptr};

            n_outputs = ubatch_pp.n_tokens;

            LLAMA_LOG_DEBUG("%s: reserving graph for n_tokens = %d, n_seqs = %d\n", __func__, ubatch_pp.n_tokens, ubatch_pp.n_seqs);

            auto * gf = graph_init();
            graph_build(ctx_compute.get(), gf, ubatch_pp, LLM_GRAPH_TYPE_DEFAULT);

            if (!ggml_backend_sched_reserve(sched.get(), gf)) {
                throw std::runtime_error("failed to allocate compute pp buffers");
            }
        }

        n_outputs = n_outputs_save;

        for (size_t i = 0; i < backend_ptrs.size(); ++i) {
            ggml_backend_t             backend = backend_ptrs[i];
            ggml_backend_buffer_type_t buft    = backend_buft[i];
            size_t size = ggml_backend_sched_get_buffer_size(sched.get(), backend);
            if (size > 1) {
                LLAMA_LOG_INFO("%s: %10s compute buffer size = %8.2f MiB\n", __func__,
                        ggml_backend_buft_name(buft),
                        size / 1024.0 / 1024.0);
            }
        }

        if (n_nodes_pp == n_nodes_tg) {
            LLAMA_LOG_INFO("%s: graph nodes  = %d\n", __func__, n_nodes_pp);
        } else {
            LLAMA_LOG_INFO("%s: graph nodes  = %d (with bs=%d), %d (with bs=1)\n", __func__, n_nodes_pp, n_tokens, n_nodes_tg);
        }

        if (n_splits_pp == n_splits_tg) {
            LLAMA_LOG_INFO("%s: graph splits = %d\n", __func__, n_splits_pp);
        } else {
            LLAMA_LOG_INFO("%s: graph splits = %d (with bs=%d), %d (with bs=1)\n", __func__, n_splits_pp, n_tokens, n_splits_tg);
        }
    }
}